

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall QDockAreaLayoutItem::sizeHint(QDockAreaLayoutItem *this)

{
  Representation RVar1;
  int iVar2;
  int iVar3;
  int extraout_var;
  undefined4 extraout_var_00;
  QSize QVar4;
  ulong uVar5;
  QMargins QVar6;
  
  if (this->placeHolderItem == (QPlaceHolderItem *)0x0) {
    if (this->widgetItem == (QLayoutItem *)0x0) {
      if (this->subinfo == (QDockAreaLayoutInfo *)0x0) {
        QVar4.wd.m_i = -1;
        QVar4.ht.m_i = 0;
        uVar5 = 0xffffffff;
      }
      else {
        QVar4 = QDockAreaLayoutInfo::sizeHint(this->subinfo);
        uVar5 = (ulong)QVar4 >> 0x20;
      }
    }
    else {
      iVar2 = (*this->widgetItem->_vptr_QLayoutItem[2])();
      iVar3 = (*this->widgetItem->_vptr_QLayoutItem[0xd])();
      QVar6 = QWidget::contentsMargins((QWidget *)CONCAT44(extraout_var_00,iVar3));
      QVar4 = (QSize)(QVar6._0_8_ + CONCAT44(extraout_var,iVar2) + QVar6._8_8_);
      uVar5 = (ulong)(uint)(QVar6.m_bottom.m_i.m_i + QVar6.m_top.m_i.m_i + extraout_var);
    }
    RVar1 = QVar4.wd.m_i;
  }
  else {
    RVar1.m_i = 0;
    uVar5 = 0;
  }
  return (QSize)((ulong)(uint)RVar1.m_i | uVar5 << 0x20);
}

Assistant:

QSize QDockAreaLayoutItem::sizeHint() const
{
    if (placeHolderItem != nullptr)
        return QSize(0, 0);
    if (widgetItem)
        return widgetItem->sizeHint().grownBy(widgetItem->widget()->contentsMargins());
    if (subinfo != nullptr)
        return subinfo->sizeHint();
    return QSize(-1, -1);
}